

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<int,long>
          (String *__return_storage_ptr__,detail *this,int *lhs,char *op,long *rhs)

{
  size_t sVar1;
  anon_union_24_2_13149d16_for_String_2 local_78;
  anon_union_24_2_13149d16_for_String_2 local_60;
  anon_union_24_2_13149d16_for_String_2 local_48;
  anon_union_24_2_13149d16_for_String_2 local_30;
  
  doctest::toString((String *)&local_48.data,*(int *)this);
  sVar1 = strlen((char *)lhs);
  String::String((String *)&local_60.data,(char *)lhs,(uint)sVar1);
  String::operator+((String *)&local_30.data,(String *)&local_48.data,(String *)&local_60.data);
  doctest::toString((String *)&local_78.data,*(long *)op);
  String::operator+(__return_storage_ptr__,(String *)&local_30.data,(String *)&local_78.data);
  if ((local_78.buf[0x17] < '\0') && (local_78.data.ptr != (char *)0x0)) {
    operator_delete__(local_78.data.ptr);
  }
  if ((local_30.buf[0x17] < '\0') && (local_30.data.ptr != (char *)0x0)) {
    operator_delete__(local_30.data.ptr);
  }
  if ((local_60.buf[0x17] < '\0') && (local_60.data.ptr != (char *)0x0)) {
    operator_delete__(local_60.data.ptr);
  }
  if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
    operator_delete__(local_48.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }